

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmsockets.c
# Opt level: O0

int check_host(char *hostname,void *sin_addr)

{
  int iVar1;
  undefined4 *in_RSI;
  char *in_RDI;
  in_addr addr;
  hostent *host_addr;
  undefined4 local_24;
  hostent *local_20;
  undefined4 *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = gethostbyname(in_RDI);
  if (local_20 == (hostent *)0x0) {
    iVar1 = inet_pton(2,local_10,&local_24);
    if (iVar1 == 0) {
      return 0;
    }
    *local_18 = local_24;
  }
  else {
    memcpy(local_18,*local_20->h_addr_list,(long)local_20->h_length);
  }
  return 1;
}

Assistant:

static int
check_host(char *hostname, void *sin_addr)
{
    struct hostent *host_addr;
    host_addr = gethostbyname(hostname);
    if (host_addr == NULL) {
	struct in_addr addr;
	if (inet_pton(PF_INET, hostname, &addr) == 0) {
//	if (inet_aton(hostname, &addr) == 0) {
	    /* 
	     *  not translatable as a hostname or 
	     * as a dot-style string IP address
	     */
	    return 0;
	}
	assert(sizeof(int) == sizeof(struct in_addr));
	*((int *) sin_addr) = *((int*) &addr);
    } else {
	memcpy(sin_addr, host_addr->h_addr, host_addr->h_length);
    }
    return 1;
}